

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalPhraseMergeToken(Fts3Table *pTab,Fts3Phrase *p,int iToken,char *pList,int nList)

{
  long in_RCX;
  int in_EDX;
  long *in_RSI;
  undefined4 in_R8D;
  int nDiff;
  int nRight;
  int nLeft;
  char *pRight;
  char *pLeft;
  int rc;
  undefined4 in_stack_00000030;
  int in_stack_0000004c;
  int in_stack_00000050;
  undefined4 local_40;
  long local_38;
  int local_28;
  
  local_28 = 0;
  if (in_RCX == 0) {
    sqlite3_free((void *)0x1c13c9);
    *in_RSI = 0;
    *(undefined4 *)(in_RSI + 1) = 0;
  }
  else if (*(int *)((long)in_RSI + 0x3c) < 0) {
    *in_RSI = in_RCX;
    *(undefined4 *)(in_RSI + 1) = in_R8D;
  }
  else if (*in_RSI == 0) {
    sqlite3_free((void *)0x1c1424);
  }
  else {
    local_40 = in_R8D;
    local_38 = in_RCX;
    if (in_EDX <= *(int *)((long)in_RSI + 0x3c)) {
      local_38 = *in_RSI;
      local_40 = (undefined4)in_RSI[1];
    }
    local_28 = fts3DoclistPhraseMerge
                         (in_stack_00000050,in_stack_0000004c,(char *)pTab,p._4_4_,
                          (char **)CONCAT44(iToken,in_stack_00000030),(int *)pList);
    sqlite3_free((void *)0x1c14e5);
    *in_RSI = local_38;
    *(undefined4 *)(in_RSI + 1) = local_40;
  }
  if (*(int *)((long)in_RSI + 0x3c) < in_EDX) {
    *(int *)((long)in_RSI + 0x3c) = in_EDX;
  }
  return local_28;
}

Assistant:

static int fts3EvalPhraseMergeToken(
  Fts3Table *pTab,                /* FTS Table pointer */
  Fts3Phrase *p,                  /* Phrase to merge pList/nList into */
  int iToken,                     /* Token pList/nList corresponds to */
  char *pList,                    /* Pointer to doclist */
  int nList                       /* Number of bytes in pList */
){
  int rc = SQLITE_OK;
  assert( iToken!=p->iDoclistToken );

  if( pList==0 ){
    sqlite3_free(p->doclist.aAll);
    p->doclist.aAll = 0;
    p->doclist.nAll = 0;
  }

  else if( p->iDoclistToken<0 ){
    p->doclist.aAll = pList;
    p->doclist.nAll = nList;
  }

  else if( p->doclist.aAll==0 ){
    sqlite3_free(pList);
  }

  else {
    char *pLeft;
    char *pRight;
    int nLeft;
    int nRight;
    int nDiff;

    if( p->iDoclistToken<iToken ){
      pLeft = p->doclist.aAll;
      nLeft = p->doclist.nAll;
      pRight = pList;
      nRight = nList;
      nDiff = iToken - p->iDoclistToken;
    }else{
      pRight = p->doclist.aAll;
      nRight = p->doclist.nAll;
      pLeft = pList;
      nLeft = nList;
      nDiff = p->iDoclistToken - iToken;
    }

    rc = fts3DoclistPhraseMerge(
        pTab->bDescIdx, nDiff, pLeft, nLeft, &pRight, &nRight
    );
    sqlite3_free(pLeft);
    p->doclist.aAll = pRight;
    p->doclist.nAll = nRight;
  }

  if( iToken>p->iDoclistToken ) p->iDoclistToken = iToken;
  return rc;
}